

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  TreeNode *this;
  Solution *this_00;
  ListNode *this_01;
  ListNode *r;
  Solution *s;
  string local_258;
  undefined1 local_238 [8];
  ListNode l2;
  string local_220;
  undefined1 local_200 [8];
  ListNode l1;
  string local_1e8;
  TreeNode *local_1c8;
  TreeNode *t4;
  undefined1 local_1a0 [8];
  TreeNode t3;
  undefined1 local_160 [8];
  TreeNode t2;
  undefined1 local_120 [8];
  TreeNode t1;
  string local_f8 [8];
  string t3String;
  string local_d0 [8];
  string t2String;
  string local_a8 [8];
  string t1String;
  undefined1 local_68 [8];
  TreeNode root;
  allocator local_31;
  string local_30 [8];
  string test;
  
  test.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"[1,2,3,4,5,6,7,8,9,null,10,11,null,12]",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)(t1String.field_2._M_local_buf + 8),local_30);
  TreeNode::TreeNode((TreeNode *)local_68,(string *)((long)&t1String.field_2 + 8));
  std::__cxx11::string::~string((string *)(t1String.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,"[1,2,3,4]",(allocator *)(t2String.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t2String.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,"[2,1,3,null,4,null,7]",(allocator *)(t3String.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(t3String.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"[1,2,3,null,4]",(allocator *)&t1.field_0x1f);
  std::allocator<char>::~allocator((allocator<char> *)&t1.field_0x1f);
  std::__cxx11::string::string((string *)&t2.len,local_a8);
  TreeNode::TreeNode((TreeNode *)local_120,(string *)&t2.len);
  std::__cxx11::string::~string((string *)&t2.len);
  std::__cxx11::string::string((string *)&t3.len,local_d0);
  TreeNode::TreeNode((TreeNode *)local_160,(string *)&t3.len);
  std::__cxx11::string::~string((string *)&t3.len);
  std::__cxx11::string::string((string *)&t4,local_f8);
  TreeNode::TreeNode((TreeNode *)local_1a0,(string *)&t4);
  std::__cxx11::string::~string((string *)&t4);
  this = (TreeNode *)operator_new(0x20);
  l1.next._7_1_ = 1;
  std::__cxx11::string::string((string *)&local_1e8,local_f8);
  TreeNode::TreeNode(this,&local_1e8);
  l1.next._7_1_ = 0;
  std::__cxx11::string::~string((string *)&local_1e8);
  local_1c8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"[5]",(allocator *)((long)&l2.next + 7));
  ListNode::ListNode((ListNode *)local_200,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&l2.next + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"[5,5]",(allocator *)((long)&s + 7));
  ListNode::ListNode((ListNode *)local_238,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  this_00 = (Solution *)operator_new(1);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  this_01 = Solution::addTwoNumbers(this_00,(ListNode *)local_200,(ListNode *)local_238);
  TreeNode::destroy(local_1c8);
  if (this_01 != (ListNode *)0x0) {
    ListNode::traverse(this_01);
  }
  ListNode::destory(this_01);
  if (this_00 != (Solution *)0x0) {
    operator_delete(this_00);
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_30);
  return test.field_2._12_4_;
}

Assistant:

int main() {
    string test = "[1,2,3,4,5,6,7,8,9,null,10,11,null,12]";
    TreeNode root(test);

    string t1String = "[1,2,3,4]";
    string t2String = "[2,1,3,null,4,null,7]";
    string t3String = "[1,2,3,null,4]";
    TreeNode t1(t1String);
    TreeNode t2(t2String);
    TreeNode t3(t3String);
    TreeNode *t4 = new TreeNode(t3String);

    ListNode l1("[5]");
    ListNode l2("[5,5]");


    Solution *s = new Solution();
    cout << endl;
    ListNode *r = s->addTwoNumbers(&l1, &l2);


    t4->destroy();
    if (r != NULL) {
        r->traverse();
    }
    r->destory();
    delete s;

}